

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O3

bool __thiscall
Qentem::Value<char>::
CopyValueTo<Qentem::StringStream<char>,void(Qentem::StringStream<char>,char_const*,unsigned_int)>
          (Value<char> *this,StringStream<char> *stream,RealFormatInfo format,
          _func_void_StringStream<char>_char_ptr_uint *string_function)

{
  SizeT new_capacity;
  uint uVar1;
  uint uVar2;
  undefined1 *puVar3;
  undefined1 uVar4;
  Value<char> *pVVar5;
  Value<char> *pVVar6;
  uint uVar7;
  char *from;
  char *to;
  ulong uVar8;
  ulong uVar9;
  StringStream<char> SVar10;
  Value<char> VStack_58;
  StringStream<char> local_38;
  
  for (; this->type_ == ValuePtr; this = (this->field_0).array_.storage_) {
  }
  uVar7 = 0x13f2e0;
  switch(this->type_) {
  case String:
    if (string_function != (_func_void_StringStream<char>_char_ptr_uint *)0x0) {
      StringStream<char>::StringStream(&local_38,stream);
      SVar10._8_8_ = (this->field_0).array_.storage_;
      SVar10.storage_ = (char *)&local_38;
      (*string_function)(SVar10,(char *)(ulong)(this->field_0).array_.index_,uVar7);
      if (local_38.storage_ != (char *)0x0) {
        MemoryRecord::RemoveAllocation(local_38.storage_);
      }
      operator_delete(local_38.storage_);
      return true;
    }
    from = (char *)(this->field_0).array_.storage_;
    uVar1 = (this->field_0).array_.index_;
    uVar2 = stream->length_;
    uVar7 = uVar2 + uVar1;
    if (stream->capacity_ < uVar7) {
      StringStream<char>::expand(stream,uVar7);
      uVar2 = stream->length_;
    }
    to = stream->storage_ + uVar2;
    goto LAB_00133325;
  case UIntLong:
    pVVar6 = (this->field_0).array_.storage_;
    puVar3 = &VStack_58.field_0x14;
    if (pVVar6 < (Value<char> *)0xa) {
LAB_001332e5:
      uVar4 = (&DigitUtils::DigitTable2)[(long)pVVar6];
      goto LAB_001332ef;
    }
    do {
      pVVar5 = pVVar6;
      pVVar6 = (Value<char> *)((ulong)pVVar5 / 100);
      *(undefined2 *)(puVar3 + -2) =
           *(undefined2 *)
            (DigitUtils::DigitTable1 + (ulong)(uint)((int)pVVar5 + (int)pVVar6 * -100) * 2);
      puVar3 = puVar3 + -2;
    } while ((Value<char> *)0x3e7 < pVVar5);
    if ((Value<char> *)0x63 < pVVar5) goto LAB_001332e5;
    break;
  case IntLong:
    uVar8 = *(ulong *)&this->field_0;
    if ((long)uVar8 < 0) {
      uVar7 = stream->length_;
      new_capacity = uVar7 + 1;
      if (stream->capacity_ == uVar7) {
        StringStream<char>::expand(stream,new_capacity);
        uVar7 = stream->length_;
      }
      uVar8 = -uVar8;
      stream->storage_[uVar7] = '-';
      stream->length_ = new_capacity;
    }
    puVar3 = &VStack_58.field_0x14;
    if (9 < uVar8) {
      do {
        uVar9 = uVar8;
        uVar8 = uVar9 / 100;
        *(undefined2 *)(puVar3 + -2) =
             *(undefined2 *)
              (DigitUtils::DigitTable1 + (ulong)(uint)((int)uVar9 + (int)uVar8 * -100) * 2);
        puVar3 = puVar3 + -2;
      } while (999 < uVar9);
      if (uVar9 < 100) break;
    }
    uVar4 = (&DigitUtils::DigitTable2)[uVar8];
LAB_001332ef:
    puVar3[-1] = uVar4;
    puVar3 = puVar3 + -1;
    break;
  case Double:
    Digit::realToString<double,Qentem::StringStream<char>,unsigned_long_long>
              (stream,(unsigned_long_long)(this->field_0).array_.storage_,format);
    return true;
  case True:
    uVar1 = stream->length_;
    uVar7 = uVar1 + 4;
    if (stream->capacity_ < uVar7) {
      StringStream<char>::expand(stream,uVar7);
      uVar1 = stream->length_;
    }
    to = stream->storage_ + uVar1;
    from = "true";
    goto LAB_001332cb;
  case False:
    uVar1 = stream->length_;
    uVar7 = uVar1 + 5;
    if (stream->capacity_ < uVar7) {
      StringStream<char>::expand(stream,uVar7);
      uVar1 = stream->length_;
    }
    to = stream->storage_ + uVar1;
    from = "false";
    uVar1 = 5;
    goto LAB_00133325;
  case Null:
    uVar1 = stream->length_;
    uVar7 = uVar1 + 4;
    if (stream->capacity_ < uVar7) {
      StringStream<char>::expand(stream,uVar7);
      uVar1 = stream->length_;
    }
    to = stream->storage_ + uVar1;
    from = "null";
LAB_001332cb:
    uVar1 = 4;
    goto LAB_00133325;
  default:
    return false;
  }
  uVar1 = (int)&VStack_58.field_0x14 - (int)puVar3;
  uVar2 = stream->length_;
  uVar7 = uVar2 + uVar1;
  if (stream->capacity_ < uVar7) {
    StringStream<char>::expand(stream,uVar7);
    uVar2 = stream->length_;
  }
  to = stream->storage_ + uVar2;
  from = (char *)((long)&VStack_58.field_0 + (ulong)(0x14 - uVar1));
LAB_00133325:
  Memory::Copy<unsigned_int>(to,from,uVar1);
  stream->length_ = uVar7;
  return true;
}

Assistant:

bool CopyValueTo(StringStream_T             &stream,
                     const Digit::RealFormatInfo format          = Digit::RealFormatInfo{Config::DoublePrecision},
                     StringFunction_T           *string_function = nullptr) const {
        switch (Type()) {
            case ValueType::String: {
                if (string_function != nullptr) {
                    string_function(stream, string_.First(), string_.Length());
                } else {
                    stream.Write(string_.First(), string_.Length());
                }

                break;
            }

            case ValueType::UIntLong: {
                Digit::NumberToString(stream, number_.Natural);
                break;
            }

            case ValueType::IntLong: {
                Digit::NumberToString(stream, number_.Integer);
                break;
            }

            case ValueType::Double: {
                Digit::NumberToString(stream, number_.Real, format);
                break;
            }

            case ValueType::True: {
                stream.Write(JSONotation::TrueString, JSONotation::TrueStringLength);
                break;
            }

            case ValueType::False: {
                stream.Write(JSONotation::FalseString, JSONotation::FalseStringLength);
                break;
            }

            case ValueType::Null: {
                stream.Write(JSONotation::NullString, JSONotation::NullStringLength);
                break;
            }

            case ValueType::ValuePtr: {
                return value_->CopyValueTo(stream, format, string_function);
            }

            default: {
                return false;
            }
        }

        return true;
    }